

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simul.cpp
# Opt level: O0

Tick __thiscall MetaSim::Simulation::run_to(Simulation *this,Tick *stop)

{
  bool bVar1;
  Tick TVar2;
  Tick *in_RSI;
  long in_RDI;
  NoMoreEventsInQueue *e;
  Simulation *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffffa8;
  Tick local_20;
  Tick *local_18;
  
  local_18 = in_RSI;
  while( true ) {
    local_20 = getNextEventTime(in_stack_ffffffffffffff88);
    bVar1 = operator<=(&local_20,local_18);
    if (!bVar1) break;
    TVar2 = sim_step((Simulation *)CONCAT17(bVar1,in_stack_ffffffffffffffa8));
    *(impl_t *)(in_RDI + 0x70) = TVar2.v;
  }
  bVar1 = operator<((Tick *)(in_RDI + 0x70),local_18);
  if (bVar1) {
    *(impl_t *)(in_RDI + 0x70) = local_18->v;
  }
  return (Tick)*(impl_t *)(in_RDI + 0x70);
}

Assistant:

const Tick Simulation::run_to(const Tick &stop)
    {
        try {
            while (getNextEventTime() <= stop) {
                globTime = sim_step();
            }
        } catch (NoMoreEventsInQueue &e) {
            cerr << "No more events in queue: simulation time = " 
                 << globTime << endl;
        }

        if (globTime < stop) globTime = stop; 

        return globTime;
    }